

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProtocolTCP.cpp
# Opt level: O0

TCPConnection * __thiscall
ProtocolTCP::NewClient
          (ProtocolTCP *this,InterfaceMAC *mac,uint8_t *remoteAddress,uint16_t remotePort,
          uint16_t localPort)

{
  TCPConnection *this_00;
  TCPConnection *pTVar1;
  TCPConnection *connection;
  size_t j;
  size_t i;
  uint16_t localPort_local;
  uint16_t remotePort_local;
  uint8_t *remoteAddress_local;
  InterfaceMAC *mac_local;
  ProtocolTCP *this_local;
  
  j = 0;
  while( true ) {
    if (4 < j) {
      return (TCPConnection *)0x0;
    }
    this_00 = (TCPConnection *)(&this->field_0x0 + j * 0x370);
    if (this_00->State == CLOSED) break;
    j = j + 1;
  }
  TCPConnection::Allocate(this_00,mac);
  this_00->LocalPort = localPort;
  this_00->SequenceNumber = 1;
  this_00->MaxSequenceTx = this_00->SequenceNumber + 0x400;
  for (connection = (TCPConnection *)0x0;
      pTVar1 = (TCPConnection *)ProtocolIPv4::AddressSize(this->IP), connection < pTVar1;
      connection = (TCPConnection *)((long)&connection->State + 1)) {
    this_00->RemoteAddress[(long)connection] = remoteAddress[(long)connection];
  }
  this_00->RemotePort = remotePort;
  return this_00;
}

Assistant:

TCPConnection* ProtocolTCP::NewClient(InterfaceMAC* mac,
                                      const uint8_t* remoteAddress,
                                      uint16_t remotePort,
                                      uint16_t localPort)
{
    size_t i;
    size_t j;

    for (i = 0; i < TCP_MAX_CONNECTIONS; i++)
    {
        TCPConnection& connection = ConnectionList[i];
        if (connection.State == TCPConnection::CLOSED)
        {
            connection.Allocate(mac);
            connection.LocalPort = localPort;
            connection.SequenceNumber = 1;
            connection.MaxSequenceTx = connection.SequenceNumber + 1024;
            for (j = 0; j < IP.AddressSize(); j++)
            {
                connection.RemoteAddress[j] = remoteAddress[j];
            }
            connection.RemotePort = remotePort;

            return &connection;
        }
    }

    return nullptr;
}